

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorReseek(Fts5Cursor *pCsr,int *pbSkip)

{
  sqlite3_vtab *psVar1;
  int iVar2;
  i64 iFirst;
  i64 iVar3;
  i64 iRowid;
  int bDesc;
  Fts5FullTable *pTab;
  int rc;
  int *pbSkip_local;
  Fts5Cursor *pCsr_local;
  
  pTab._4_4_ = 0;
  if ((pCsr->csrflags & 0x20U) != 0) {
    psVar1 = (pCsr->base).pVtab;
    iVar2 = pCsr->bDesc;
    iFirst = sqlite3Fts5ExprRowid(pCsr->pExpr);
    pTab._4_4_ = sqlite3Fts5ExprFirst(pCsr->pExpr,*(Fts5Index **)&psVar1[1].nRef,iFirst,iVar2);
    if ((pTab._4_4_ == 0) && (iVar3 = sqlite3Fts5ExprRowid(pCsr->pExpr), iFirst != iVar3)) {
      *pbSkip = 1;
    }
    pCsr->csrflags = pCsr->csrflags & 0xffffffdf;
    fts5CsrNewrow(pCsr);
    iVar2 = sqlite3Fts5ExprEof(pCsr->pExpr);
    if (iVar2 != 0) {
      pCsr->csrflags = pCsr->csrflags | 1;
      *pbSkip = 1;
    }
  }
  return pTab._4_4_;
}

Assistant:

static int fts5CursorReseek(Fts5Cursor *pCsr, int *pbSkip){
  int rc = SQLITE_OK;
  assert( *pbSkip==0 );
  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_RESEEK) ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
    int bDesc = pCsr->bDesc;
    i64 iRowid = sqlite3Fts5ExprRowid(pCsr->pExpr);

    rc = sqlite3Fts5ExprFirst(pCsr->pExpr, pTab->p.pIndex, iRowid, bDesc);
    if( rc==SQLITE_OK &&  iRowid!=sqlite3Fts5ExprRowid(pCsr->pExpr) ){
      *pbSkip = 1;
    }

    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_RESEEK);
    fts5CsrNewrow(pCsr);
    if( sqlite3Fts5ExprEof(pCsr->pExpr) ){
      CsrFlagSet(pCsr, FTS5CSR_EOF);
      *pbSkip = 1;
    }
  }
  return rc;
}